

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

int run_test_fs_poll_close_request_stop_when_active(void)

{
  int iVar1;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  
  remove("testfile");
  iVar1 = uv_loop_init((uv_loop_t *)&poll_handle.poll_ctx);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0x112,"uv_loop_init(&loop)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_poll_init((uv_loop_t *)&poll_handle.poll_ctx,(uv_fs_poll_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0x115,"uv_fs_poll_init(&loop, &poll_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_fs_poll_start((uv_fs_poll_t *)&eval_a,poll_cb_noop,"testfile",100);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0x116,"uv_fs_poll_start(&poll_handle, poll_cb_noop, \"testfile\", 100)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  uv_run((uv_loop_t *)&poll_handle.poll_ctx,UV_RUN_ONCE);
  iVar1 = uv_fs_poll_stop((uv_fs_poll_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0x11a,"uv_fs_poll_stop(&poll_handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_run((uv_loop_t *)&poll_handle.poll_ctx,UV_RUN_ONCE);
  uv_close((uv_handle_t *)&eval_a,close_cb);
  uv_run((uv_loop_t *)&poll_handle.poll_ctx,UV_RUN_ONCE);
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0x120,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  close_loop((uv_loop_t *)&poll_handle.poll_ctx);
  iVar1 = uv_loop_close((uv_loop_t *)&poll_handle.poll_ctx);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-poll.c"
            ,0x122,"0","==","uv_loop_close(&loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_poll_close_request_stop_when_active) {
  /* Regression test for https://github.com/libuv/libuv/issues/2287. */
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;

  remove(FIXTURE);

  ASSERT_OK(uv_loop_init(&loop));

  /* Set up all handles. */
  ASSERT_OK(uv_fs_poll_init(&loop, &poll_handle));
  ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_noop, FIXTURE, 100));
  uv_run(&loop, UV_RUN_ONCE);

  /* Close the timer handle, and do not crash. */
  ASSERT_OK(uv_fs_poll_stop(&poll_handle));
  uv_run(&loop, UV_RUN_ONCE);

  /* Clean up after the test. */
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  uv_run(&loop, UV_RUN_ONCE);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}